

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

void * NES_APU_np_Create(UINT32 clock,UINT32 rate)

{
  int local_2c;
  int local_28;
  int t;
  int c;
  int i;
  NES_APU *apu;
  UINT32 rate_local;
  UINT32 clock_local;
  
  _rate_local = calloc(1,0x178);
  if (_rate_local == (void *)0x0) {
    _rate_local = (void *)0x0;
  }
  else {
    NES_APU_np_SetClock(_rate_local,clock);
    NES_APU_np_SetRate(_rate_local,rate);
    *(undefined4 *)((long)_rate_local + 8) = 1;
    *(undefined4 *)((long)_rate_local + 0x10) = 1;
    *(undefined4 *)((long)_rate_local + 0xc) = 1;
    *(undefined4 *)((long)_rate_local + 0x14) = 0;
    *(undefined4 *)((long)_rate_local + 0x18) = 0;
    *(undefined4 *)((long)_rate_local + 100) = 0;
    for (t = 1; t < 0x20; t = t + 1) {
      *(int *)((long)_rate_local + (long)t * 4 + 100) =
           (int)(785448.96 / (8128.0 / (double)t + 100.0));
    }
    *(undefined4 *)((long)_rate_local + 0xe4) = *(undefined4 *)((long)_rate_local + 0xa0);
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        *(undefined4 *)((long)_rate_local + (long)local_2c * 4 + (long)local_28 * 8 + 0x20) = 0x80;
      }
    }
    *(undefined4 *)((long)_rate_local + 0x1c) = 0;
  }
  return _rate_local;
}

Assistant:

void* NES_APU_np_Create(UINT32 clock, UINT32 rate)
{
	NES_APU* apu;
	int i, c, t;

	apu = (NES_APU*)calloc(1, sizeof(NES_APU));
	if (apu == NULL)
		return NULL;

	NES_APU_np_SetClock(apu, clock);
	NES_APU_np_SetRate(apu, rate);
	apu->option[OPT_UNMUTE_ON_RESET] = true;
	apu->option[OPT_PHASE_REFRESH] = true;
	apu->option[OPT_NONLINEAR_MIXER] = true;
	apu->option[OPT_DUTY_SWAP] = false;
	apu->option[OPT_NEGATE_SWEEP_INIT] = false;

	apu->square_table[0] = 0;
	for(i=1;i<32;i++)
		apu->square_table[i]=(INT32)((8192.0*95.88)/(8128.0/i+100));

	apu->square_linear = apu->square_table[15]; // match linear scale to one full volume square of nonlinear

	for(c=0;c<2;++c)
		for(t=0;t<2;++t)
			apu->sm[c][t] = 128;

	apu->mask = 0;

	return apu;
}